

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

__pid_t __thiscall kj::Promise<bool>::wait(Promise<bool> *this,void *__stat_loc)

{
  undefined8 unaff_RBX;
  ExceptionOr<bool> result;
  NullableValue<kj::Exception> local_170;
  char local_10;
  undefined1 local_f;
  
  local_170.isSet = false;
  local_10 = '\0';
  _::waitImpl((Own<kj::_::PromiseNode> *)this,(ExceptionOrValue *)&local_170,(WaitScope *)__stat_loc
             );
  if (local_10 == '\x01') {
    if (local_170.isSet != false) {
      throwRecoverableException(&local_170.field_1.value,0);
    }
    _::NullableValue<kj::Exception>::~NullableValue(&local_170);
    return (__pid_t)CONCAT71((int7)((ulong)unaff_RBX >> 8),local_f);
  }
  if (local_170.isSet != false) {
    throwFatalException(&local_170.field_1.value,0);
  }
  _::unreachable();
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope) {
  _::ExceptionOr<_::FixVoid<T>> result;

  _::waitImpl(kj::mv(node), result, waitScope);

  KJ_IF_MAYBE(value, result.value) {
    KJ_IF_MAYBE(exception, result.exception) {
      throwRecoverableException(kj::mv(*exception));
    }
    return _::returnMaybeVoid(kj::mv(*value));
  } else KJ_IF_MAYBE(exception, result.exception) {
    throwFatalException(kj::mv(*exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }